

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdh.c
# Opt level: O0

int mbedtls_ecdh_get_params
              (mbedtls_ecdh_context *ctx,mbedtls_ecp_keypair *key,mbedtls_ecdh_side side)

{
  mbedtls_ecp_group_id mVar1;
  int iVar2;
  int ret;
  mbedtls_ecdh_side side_local;
  mbedtls_ecp_keypair *key_local;
  mbedtls_ecdh_context *ctx_local;
  
  if ((side == MBEDTLS_ECDH_OURS) || (side == MBEDTLS_ECDH_THEIRS)) {
    mVar1 = mbedtls_ecdh_grp_id(ctx);
    if (mVar1 == MBEDTLS_ECP_DP_NONE) {
      iVar2 = mbedtls_ecdh_setup(ctx,(key->grp).id);
      if (iVar2 != 0) {
        return iVar2;
      }
    }
    else {
      mVar1 = mbedtls_ecdh_grp_id(ctx);
      if (mVar1 != (key->grp).id) {
        return -0x4f80;
      }
    }
    if (ctx->var == MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0) {
      ctx_local._4_4_ = ecdh_get_params_internal(&(ctx->ctx).mbed_ecdh,key,side);
    }
    else {
      ctx_local._4_4_ = -0x4f80;
    }
  }
  else {
    ctx_local._4_4_ = -0x4f80;
  }
  return ctx_local._4_4_;
}

Assistant:

int mbedtls_ecdh_get_params(mbedtls_ecdh_context *ctx,
                            const mbedtls_ecp_keypair *key,
                            mbedtls_ecdh_side side)
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    if (side != MBEDTLS_ECDH_OURS && side != MBEDTLS_ECDH_THEIRS) {
        return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }

    if (mbedtls_ecdh_grp_id(ctx) == MBEDTLS_ECP_DP_NONE) {
        /* This is the first call to get_params(). Set up the context
         * for use with the group. */
        if ((ret = mbedtls_ecdh_setup(ctx, key->grp.id)) != 0) {
            return ret;
        }
    } else {
        /* This is not the first call to get_params(). Check that the
         * current key's group is the same as the context's, which was set
         * from the first key's group. */
        if (mbedtls_ecdh_grp_id(ctx) != key->grp.id) {
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
        }
    }

#if defined(MBEDTLS_ECDH_LEGACY_CONTEXT)
    return ecdh_get_params_internal(ctx, key, side);
#else
    switch (ctx->var) {
#if defined(MBEDTLS_ECDH_VARIANT_EVEREST_ENABLED)
        case MBEDTLS_ECDH_VARIANT_EVEREST:
        {
            mbedtls_everest_ecdh_side s = side == MBEDTLS_ECDH_OURS ?
                                          MBEDTLS_EVEREST_ECDH_OURS :
                                          MBEDTLS_EVEREST_ECDH_THEIRS;
            return mbedtls_everest_get_params(&ctx->ctx.everest_ecdh,
                                              key, s);
        }
#endif
        case MBEDTLS_ECDH_VARIANT_MBEDTLS_2_0:
            return ecdh_get_params_internal(&ctx->ctx.mbed_ecdh,
                                            key, side);
        default:
            return MBEDTLS_ERR_ECP_BAD_INPUT_DATA;
    }
#endif
}